

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O2

SubMeshXml * __thiscall Assimp::Ogre::MeshXml::GetSubMesh(MeshXml *this,uint16_t index)

{
  pointer ppSVar1;
  SubMeshXml *pSVar2;
  undefined2 in_register_00000032;
  ulong uVar3;
  
  ppSVar1 = (this->subMeshes).
            super__Vector_base<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = 0;
  do {
    if ((ulong)((long)(this->subMeshes).
                      super__Vector_base<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3) <= uVar3) {
      return (SubMeshXml *)0x0;
    }
    pSVar2 = ppSVar1[uVar3];
    uVar3 = uVar3 + 1;
  } while ((pSVar2->super_ISubMesh).index != CONCAT22(in_register_00000032,index));
  return pSVar2;
}

Assistant:

SubMeshXml *MeshXml::GetSubMesh(uint16_t index) const
{
    for(size_t i=0; i<subMeshes.size(); ++i)
        if (subMeshes[i]->index == index)
            return subMeshes[i];
    return 0;
}